

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O1

void __thiscall
JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::update_sequence_point
          (JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this)

{
  HalfCycles HVar1;
  long lVar2;
  
  HVar1 = Motorola::MFP68901::MFP68901::next_sequence_point(&this->object_);
  lVar2 = (long)HVar1.super_WrappedInt<HalfCycles>.length_ * 0x28cc55;
  if (HVar1.super_WrappedInt<HalfCycles>.length_ == 0x7fffffffffffffff) {
    lVar2 = 0x7fffffffffffffff;
  }
  (this->time_until_event_).super_WrappedInt<HalfCycles>.length_ = lVar2;
  if (0 < lVar2) {
    return;
  }
  __assert_fail("time_until_event_ > LocalTimeScale(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                ,0x102,
                "void JustInTimeActor<Motorola::MFP68901::MFP68901, HalfCycles, 819200, 2673749>::update_sequence_point() [T = Motorola::MFP68901::MFP68901, LocalTimeScale = HalfCycles, multiplier = 819200, divider = 2673749]"
               );
}

Assistant:

void update_sequence_point() {
			if constexpr (has_sequence_points<T>::value) {
				// Keep a fast path where no conversions will be applied; if conversions are
				// going to be applied then do a direct max -> max translation rather than
				// allowing the arithmetic to overflow.
				if constexpr (divider == 1 && std::is_same_v<LocalTimeScale, TargetTimeScale>) {
					time_until_event_ = object_.next_sequence_point();
				} else {
					const auto time = object_.next_sequence_point();
					if(time == TargetTimeScale::max()) {
						time_until_event_ = LocalTimeScale::max();
					} else {
						time_until_event_ = time * divider;
					}
				}
				assert(time_until_event_ > LocalTimeScale(0));
			}
		}